

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f *uv,Float time,Vector3f *wo)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> *t0;
  Tuple2<pbrt::Point2,_float> *t0_00;
  Tuple2<pbrt::Point2,_float> *t1;
  Tuple2<pbrt::Point2,_float> *t1_00;
  Float t;
  bool bVar5;
  bool bVar6;
  Point3f *pPVar7;
  Point2f *pPVar8;
  Normal3f *pNVar9;
  undefined1 auVar10 [16];
  undefined4 in_register_00000014;
  long lVar11;
  int iVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar17;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Point2<float> PVar18;
  undefined1 auVar62 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined8 uVar60;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar69 [60];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Point3<float> PVar87;
  Vector3<float> VVar88;
  Normal3<float> NVar89;
  Normal3<float> NVar90;
  Vector3<float> local_288;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  undefined8 uStack_260;
  Tuple3<pbrt::Vector3,_float> local_250;
  Tuple3<pbrt::Point3,_float> local_240;
  float local_234;
  Point3f p10;
  Point3f p00;
  Point3f p01;
  Point3f p11;
  Tuple3<pbrt::Point3,_float> local_1c8;
  undefined1 local_1b8 [16];
  Point2f uvTex;
  Tuple3<pbrt::Normal3,_float> local_198;
  float va;
  float fStack_184;
  float local_180;
  double vb;
  float local_170;
  undefined8 local_168;
  long local_160;
  Vector3f *local_158;
  Normal3f n11;
  Normal3f n01;
  Normal3f n10;
  Normal3f n00;
  Tuple3<pbrt::Point3,_float> local_110;
  Tuple3<pbrt::Point3,_float> local_100;
  Transform r;
  Tuple3<pbrt::Point3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Normal3,_float> local_40;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar61;
  
  local_168 = CONCAT44(in_register_00000014,patchIndex);
  piVar13 = mesh->vertexIndices;
  lVar11 = (long)(patchIndex * 4);
  pPVar7 = mesh->p;
  p00.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar13[lVar11]].super_Tuple3<pbrt::Point3,_float>.z;
  p00.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar13[lVar11]].super_Tuple3<pbrt::Point3,_float>.x;
  p00.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar13[lVar11]].super_Tuple3<pbrt::Point3,_float>.y;
  p10.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar13[lVar11 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  p10.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar13[lVar11 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  p10.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar13[lVar11 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  p01.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar13[lVar11 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  p01.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar13[lVar11 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  p01.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar13[lVar11 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  p11.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar7[piVar13[lVar11 + 3]].super_Tuple3<pbrt::Point3,_float>.z;
  p11.super_Tuple3<pbrt::Point3,_float>.x =
       pPVar7[piVar13[lVar11 + 3]].super_Tuple3<pbrt::Point3,_float>.x;
  p11.super_Tuple3<pbrt::Point3,_float>.y =
       pPVar7[piVar13[lVar11 + 3]].super_Tuple3<pbrt::Point3,_float>.y;
  local_268 = (uv->super_Tuple2<pbrt::Point2,_float>).x;
  auVar62 = (undefined1  [56])0x0;
  local_158 = wo;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                      &p00.super_Tuple3<pbrt::Point3,_float>,&p01.super_Tuple3<pbrt::Point3,_float>)
  ;
  r.m.m[0][2] = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  auVar35._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar35._8_56_ = auVar62;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar35._0_16_);
  auVar62 = (undefined1  [56])0x0;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                      &p10.super_Tuple3<pbrt::Point3,_float>,&p11.super_Tuple3<pbrt::Point3,_float>)
  ;
  local_240.z = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  auVar31._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar62;
  local_240._0_8_ = vmovlps_avx(auVar31._0_16_);
  auVar62 = (undefined1  [56])0x0;
  PVar87 = Lerp<pbrt::Point3,float>(local_268,(Tuple3<pbrt::Point3,_float> *)&r,&local_240);
  local_110.z = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  auVar32._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar32._8_56_ = auVar62;
  local_110._0_8_ = vmovlps_avx(auVar32._0_16_);
  uVar60 = 0;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                      &p10.super_Tuple3<pbrt::Point3,_float>,&p11.super_Tuple3<pbrt::Point3,_float>)
  ;
  local_278._0_4_ = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  local_268 = PVar87.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_264 = PVar87.super_Tuple3<pbrt::Point3,_float>.y;
  auVar62 = (undefined1  [56])0x0;
  uStack_260 = uVar60;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                      &p00.super_Tuple3<pbrt::Point3,_float>,&p01.super_Tuple3<pbrt::Point3,_float>)
  ;
  auVar33._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar33._8_56_ = auVar62;
  auVar14._4_4_ = fStack_264;
  auVar14._0_4_ = local_268;
  auVar14._8_8_ = uStack_260;
  local_1b8 = vsubps_avx(auVar14,auVar33._0_16_);
  local_240.z = (float)local_278._0_4_ - PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  local_240._0_8_ = vmovlps_avx(local_1b8);
  uVar60 = 0;
  local_234 = local_240.z;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).x,
                      &p01.super_Tuple3<pbrt::Point3,_float>,&p11.super_Tuple3<pbrt::Point3,_float>)
  ;
  local_268 = PVar87.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_264 = PVar87.super_Tuple3<pbrt::Point3,_float>.y;
  auVar62 = (undefined1  [56])0x0;
  local_278._0_4_ = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  uStack_260 = uVar60;
  PVar87 = Lerp<pbrt::Point3,float>
                     ((uv->super_Tuple2<pbrt::Point2,_float>).x,
                      &p00.super_Tuple3<pbrt::Point3,_float>,&p10.super_Tuple3<pbrt::Point3,_float>)
  ;
  auVar34._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar34._8_56_ = auVar62;
  auVar30._4_4_ = fStack_264;
  auVar30._0_4_ = local_268;
  auVar30._8_8_ = uStack_260;
  auVar14 = vsubps_avx(auVar30,auVar34._0_16_);
  auVar35 = ZEXT1664(auVar14);
  local_288.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)local_278._0_4_ - PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  local_288.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar14);
  uvTex = *(Point2f *)&uv->super_Tuple2<pbrt::Point2,_float>;
  pPVar8 = mesh->uv;
  local_160 = lVar11;
  if (pPVar8 == (Point2f *)0x0) {
    auVar14 = vmovshdup_avx(auVar14);
    fVar78 = auVar14._0_4_;
    auVar23 = local_1b8;
    goto LAB_002c1057;
  }
  local_268 = uvTex.super_Tuple2<pbrt::Point2,_float>.x;
  local_1b8._0_8_ = piVar13;
  t0 = &pPVar8[piVar13[lVar11]].super_Tuple2<pbrt::Point2,_float>;
  t0_00 = &pPVar8[piVar13[lVar11 + 1]].super_Tuple2<pbrt::Point2,_float>;
  t1 = &pPVar8[piVar13[lVar11 + 2]].super_Tuple2<pbrt::Point2,_float>;
  t1_00 = &pPVar8[piVar13[lVar11 + 3]].super_Tuple2<pbrt::Point2,_float>;
  PVar18 = Lerp<pbrt::Point2,float>(uvTex.super_Tuple2<pbrt::Point2,_float>.y,t0,t1);
  uStack_270 = extraout_XMM0_Qb;
  local_278._0_4_ = PVar18.super_Tuple2<pbrt::Point2,_float>.x;
  local_278._4_4_ = PVar18.super_Tuple2<pbrt::Point2,_float>.y;
  PVar18 = Lerp<pbrt::Point2,float>((uv->super_Tuple2<pbrt::Point2,_float>).y,t0_00,t1_00);
  auVar14 = vpbroadcastd_avx512vl();
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  fVar78 = 1.0 - local_268;
  auVar23 = vinsertps_avx(ZEXT416((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.z),
                          ZEXT416((uint)local_240.z),0x10);
  auVar19._0_4_ =
       fVar78 * (float)local_278._0_4_ + PVar18.super_Tuple2<pbrt::Point2,_float>.x * auVar14._0_4_;
  auVar19._4_4_ =
       fVar78 * (float)local_278._4_4_ + PVar18.super_Tuple2<pbrt::Point2,_float>.y * auVar14._4_4_;
  auVar19._8_4_ = fVar78 * (float)uStack_270 + (float)extraout_XMM0_Qb_00 * auVar14._8_4_;
  auVar19._12_4_ =
       fVar78 * uStack_270._4_4_ + (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) * auVar14._12_4_;
  uvTex.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19);
  fVar78 = t0->x;
  auVar71._4_4_ = fVar78;
  auVar71._0_4_ = fVar78;
  auVar71._8_4_ = fVar78;
  auVar71._12_4_ = fVar78;
  fVar77 = t0->y;
  auVar84._4_4_ = fVar77;
  auVar84._0_4_ = fVar77;
  auVar84._8_4_ = fVar77;
  auVar84._12_4_ = fVar77;
  auVar14 = vinsertps_avx(ZEXT416((uint)t1->x),ZEXT416((uint)t0_00->x),0x10);
  auVar30 = vinsertps_avx(ZEXT416((uint)t1->y),ZEXT416((uint)t0_00->y),0x10);
  auVar14 = vsubps_avx(auVar14,auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uv->super_Tuple2<pbrt::Point2,_float>;
  auVar30 = vsubps_avx(auVar30,auVar84);
  fVar78 = ((fVar78 - t1->x) - t0_00->x) + t1_00->x;
  fVar77 = ((fVar77 - t1->y) - t0_00->y) + t1_00->y;
  auVar82._8_4_ = 0x7fffffff;
  auVar82._0_8_ = 0x7fffffff7fffffff;
  auVar82._12_4_ = 0x7fffffff;
  auVar79._4_4_ = fVar78;
  auVar79._0_4_ = fVar78;
  auVar79._8_4_ = fVar78;
  auVar79._12_4_ = fVar78;
  auVar83._4_4_ = fVar77;
  auVar83._0_4_ = fVar77;
  auVar83._8_4_ = fVar77;
  auVar83._12_4_ = fVar77;
  auVar15 = vfmadd213ps_fma(auVar79,auVar72,auVar14);
  auVar20._8_4_ = 0x322bcc77;
  auVar20._0_8_ = 0x322bcc77322bcc77;
  auVar20._12_4_ = 0x322bcc77;
  auVar16 = vfmadd213ps_fma(auVar83,auVar72,auVar30);
  auVar14 = vandps_avx(auVar15,auVar82);
  auVar30 = vandps_avx(auVar16,auVar82);
  uVar61 = vcmpps_avx512vl(auVar14,auVar20,5);
  auVar14 = vdivps_avx512vl(auVar86,auVar15);
  fVar78 = (float)((uint)((byte)uVar61 & 1) * auVar14._0_4_);
  fVar70 = (float)((uint)((byte)(uVar61 >> 1) & 1) * auVar14._4_4_);
  auVar15._4_4_ = fVar70;
  auVar15._0_4_ = fVar78;
  fVar17 = (float)((uint)((byte)(uVar61 >> 2) & 1) * auVar14._8_4_);
  auVar15._8_4_ = fVar17;
  fVar77 = (float)((uint)((byte)(uVar61 >> 3) & 1) * auVar14._12_4_);
  auVar15._12_4_ = fVar77;
  uVar61 = vcmpps_avx512vl(auVar30,auVar20,5);
  auVar14 = vdivps_avx512vl(auVar86,auVar16);
  fVar1 = (float)((uint)((byte)uVar61 & 1) * auVar14._0_4_);
  fVar2 = (float)((uint)((byte)(uVar61 >> 1) & 1) * auVar14._4_4_);
  auVar16._4_4_ = fVar2;
  auVar16._0_4_ = fVar1;
  fVar3 = (float)((uint)((byte)(uVar61 >> 2) & 1) * auVar14._8_4_);
  auVar16._8_4_ = fVar3;
  fVar4 = (float)((uint)((byte)(uVar61 >> 3) & 1) * auVar14._12_4_);
  auVar16._12_4_ = fVar4;
  auVar85._0_4_ = auVar23._0_4_ * fVar78;
  auVar85._4_4_ = auVar23._4_4_ * fVar70;
  auVar85._8_4_ = auVar23._8_4_ * fVar17;
  auVar85._12_4_ = auVar23._12_4_ * fVar77;
  auVar15 = vmovshdup_avx(auVar15);
  auVar63._0_4_ = auVar23._0_4_ * fVar1;
  auVar63._4_4_ = auVar23._4_4_ * fVar2;
  auVar63._8_4_ = auVar23._8_4_ * fVar3;
  auVar63._12_4_ = auVar23._12_4_ * fVar4;
  auVar23 = vmovshdup_avx(auVar16);
  auVar14 = vhaddps_avx(auVar85,auVar85);
  auVar30 = vhaddps_avx(auVar63,auVar63);
  auVar69 = ZEXT1260(auVar30._4_12_);
  auVar80._0_4_ =
       auVar15._0_4_ * local_240.x + local_288.super_Tuple3<pbrt::Vector3,_float>.x * fVar78;
  auVar80._4_4_ =
       auVar15._4_4_ * local_240.y + local_288.super_Tuple3<pbrt::Vector3,_float>.y * fVar78;
  auVar80._8_4_ = auVar15._8_4_ * 0.0 + fVar78 * 0.0;
  auVar80._12_4_ = auVar15._12_4_ * 0.0 + fVar78 * 0.0;
  auVar21._0_4_ =
       local_240.x * auVar23._0_4_ + local_288.super_Tuple3<pbrt::Vector3,_float>.x * fVar1;
  auVar21._4_4_ =
       local_240.y * auVar23._4_4_ + local_288.super_Tuple3<pbrt::Vector3,_float>.y * fVar1;
  auVar21._8_4_ = auVar23._8_4_ * 0.0 + fVar1 * 0.0;
  auVar21._12_4_ = auVar23._12_4_ * 0.0 + fVar1 * 0.0;
  auVar62 = ZEXT856(auVar21._8_8_);
  r.m.m[0]._0_8_ = vmovlps_avx(auVar80);
  r.m.m[0][2] = auVar14._0_4_;
  local_250._0_8_ = vmovlps_avx(auVar21);
  local_250.z = auVar30._0_4_;
  VVar88 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&local_250);
  auVar36._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = auVar62;
  if (VVar88.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) {
    auVar14 = vmovshdup_avx(auVar36._0_16_);
    auVar62 = ZEXT856(auVar14._8_8_);
    if ((auVar14._0_4_ != 0.0) || (NAN(auVar14._0_4_))) goto LAB_002c0ed3;
    auVar62 = ZEXT856(0);
    if ((VVar88.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
       (NAN(VVar88.super_Tuple3<pbrt::Vector3,_float>.z))) goto LAB_002c0ed3;
  }
  else {
LAB_002c0ed3:
    VVar88 = Cross<float>((Vector3<float> *)&local_240,&local_288);
    local_268 = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar37._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar37._8_56_ = auVar62;
    _local_278 = auVar37._0_16_;
    VVar88 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&local_250);
    auVar65._0_4_ = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar65._4_60_ = auVar69;
    auVar38._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar38._8_56_ = auVar62;
    auVar73._0_4_ = local_278._0_4_ * VVar88.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar73._4_4_ = local_278._4_4_ * VVar88.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar73._8_4_ = local_278._8_4_ * auVar62._0_4_;
    auVar73._12_4_ = local_278._12_4_ * auVar62._4_4_;
    auVar14 = vmovshdup_avx(auVar73);
    auVar14 = vfmadd231ss_fma(auVar14,_local_278,auVar38._0_16_);
    auVar14 = vfmadd231ss_fma(auVar14,auVar65._0_16_,ZEXT416((uint)local_268));
    uVar61 = 0;
    if (auVar14._0_4_ < 0.0) {
      auVar22._0_8_ = local_250._0_8_ ^ 0x8000000080000000;
      auVar22._8_4_ = 0x80000000;
      auVar22._12_4_ = 0x80000000;
      uVar61 = auVar22._8_8_;
      local_250.z = -local_250.z;
      auVar65 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,CONCAT44(0x80000000,local_250.z)))
                        );
      local_250._0_8_ = vmovlps_avx(auVar22);
    }
    auVar69 = auVar65._4_60_;
    auVar62 = ZEXT856(uVar61);
    VVar88 = Cross<float>((Vector3<float> *)&local_240,&local_288);
    local_170 = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar39._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar39._8_56_ = auVar62;
    vb = (double)vmovlps_avx(auVar39._0_16_);
    VVar88 = Normalize<float>((Vector3<float> *)&vb);
    local_268 = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar40._8_56_ = auVar62;
    _local_278 = auVar40._0_16_;
    VVar88 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&local_250);
    local_180 = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar41._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar41._8_56_ = auVar62;
    _va = vmovlps_avx(auVar41._0_16_);
    VVar88 = Normalize<float>((Vector3<float> *)&va);
    auVar66._0_4_ = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar66._4_60_ = auVar69;
    auVar42._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar42._8_56_ = auVar62;
    vb = -0.001;
    auVar74._0_4_ = local_278._0_4_ * VVar88.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar74._4_4_ = local_278._4_4_ * VVar88.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar74._8_4_ = local_278._8_4_ * auVar62._0_4_;
    auVar74._12_4_ = local_278._12_4_ * auVar62._4_4_;
    auVar14 = vmovshdup_avx(auVar74);
    auVar14 = vfmadd231ss_fma(auVar14,_local_278,auVar42._0_16_);
    auVar14 = vfmadd231ss_fma(auVar14,auVar66._0_16_,ZEXT416((uint)local_268));
    va = auVar14._0_4_;
    if (auVar14._0_4_ < -0.001) {
      LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.h"
                 ,0x584,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 (char (*) [6])"-1e-3",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 &va,(char (*) [6])"-1e-3",&vb);
    }
    local_240.x = r.m.m[0][0];
    local_240.y = r.m.m[0][1];
    local_240.z = r.m.m[0][2];
    local_288.super_Tuple3<pbrt::Vector3,_float>.x = local_250.x;
    local_288.super_Tuple3<pbrt::Vector3,_float>.y = local_250.y;
    local_288.super_Tuple3<pbrt::Vector3,_float>.z = local_250.z;
  }
  auVar23._8_8_ = 0;
  auVar23._0_4_ = local_240.x;
  auVar23._4_4_ = local_240.y;
  auVar35 = ZEXT464((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.x);
  piVar13 = (int *)local_1b8._0_8_;
  local_234 = local_240.z;
  fVar78 = local_288.super_Tuple3<pbrt::Vector3,_float>.y;
LAB_002c1057:
  auVar62 = auVar35._8_56_;
  auVar69 = (undefined1  [60])0x0;
  local_268 = ((p00.super_Tuple3<pbrt::Point3,_float>.x - p01.super_Tuple3<pbrt::Point3,_float>.x) -
              p10.super_Tuple3<pbrt::Point3,_float>.x) + p11.super_Tuple3<pbrt::Point3,_float>.x;
  local_278._0_4_ =
       ((p00.super_Tuple3<pbrt::Point3,_float>.y - p01.super_Tuple3<pbrt::Point3,_float>.y) -
       p10.super_Tuple3<pbrt::Point3,_float>.y) + p11.super_Tuple3<pbrt::Point3,_float>.y;
  local_1b8._0_4_ =
       ((p00.super_Tuple3<pbrt::Point3,_float>.z - p01.super_Tuple3<pbrt::Point3,_float>.z) -
       p10.super_Tuple3<pbrt::Point3,_float>.z) + p11.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14 = vmovshdup_avx(auVar23);
  fVar77 = auVar14._0_4_;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77)),auVar23,auVar23);
  auVar15 = auVar35._0_16_;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar78)),auVar15,auVar23);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78)),auVar15,auVar15);
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_234),ZEXT416((uint)local_234));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_234));
  auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_288.super_Tuple3<pbrt::Vector3,_float>.z));
  local_234 = auVar14._0_4_;
  fVar78 = auVar30._0_4_;
  fVar70 = auVar23._0_4_;
  VVar88 = Cross<float>((Vector3<float> *)&local_240,&local_288);
  r.m.m[0][2] = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar43._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar43._8_56_ = auVar62;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar43._0_16_);
  VVar88 = Normalize<float>((Vector3<float> *)&r);
  auVar67._0_4_ = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar67._4_60_ = auVar69;
  auVar44._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar44._8_56_ = auVar62;
  auVar23 = auVar44._0_16_;
  auVar14 = vmovshdup_avx(auVar23);
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * 0.0)),auVar23,ZEXT816(0) << 0x40);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * (float)local_278._0_4_)),auVar23,
                            ZEXT416((uint)local_268));
  auVar30 = vfmadd231ss_fma(auVar30,auVar67._0_16_,ZEXT816(0) << 0x40);
  auVar14 = vfmadd231ss_fma(auVar14,auVar67._0_16_,ZEXT416((uint)local_1b8._0_4_));
  auVar16 = ZEXT416((uint)fVar78);
  auVar23 = vfmsub231ss_fma(ZEXT416((uint)(fVar78 * fVar78)),ZEXT416((uint)local_234),
                            ZEXT416((uint)fVar70));
  fVar17 = 1.0 / auVar23._0_4_;
  auVar23 = vfmsub231ss_fma(ZEXT416((uint)(local_234 * auVar14._0_4_)),auVar30,auVar16);
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar70 * auVar30._0_4_)),auVar14,auVar16);
  fVar78 = fVar17 * auVar15._0_4_;
  fVar77 = fVar17 * auVar23._0_4_;
  local_250.z = local_288.super_Tuple3<pbrt::Vector3,_float>.z * fVar77 + local_240.z * fVar78;
  auVar64._0_4_ = local_240.x * fVar78 + local_288.super_Tuple3<pbrt::Vector3,_float>.x * fVar77;
  auVar64._4_4_ = local_240.y * fVar78 + local_288.super_Tuple3<pbrt::Vector3,_float>.y * fVar77;
  auVar64._8_4_ = fVar78 * 0.0 + fVar77 * 0.0;
  auVar64._12_4_ = fVar78 * 0.0 + fVar77 * 0.0;
  local_250._0_8_ = vmovlps_avx(auVar64);
  auVar23 = vfmsub231ss_fma(ZEXT416((uint)(fVar70 * auVar14._0_4_)),auVar30,auVar16);
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(local_234 * auVar30._0_4_)),auVar16,auVar14);
  fVar78 = fVar17 * auVar23._0_4_;
  fVar17 = fVar17 * auVar14._0_4_;
  local_170 = local_240.z * fVar78 + local_288.super_Tuple3<pbrt::Vector3,_float>.z * fVar17;
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar24._0_4_ = local_240.x * fVar78 + local_288.super_Tuple3<pbrt::Vector3,_float>.x * fVar17;
  auVar24._4_4_ = local_240.y * fVar78 + local_288.super_Tuple3<pbrt::Vector3,_float>.y * fVar17;
  auVar24._8_4_ = fVar78 * 0.0 + fVar17 * 0.0;
  auVar24._12_4_ = fVar78 * 0.0 + fVar17 * 0.0;
  vb = (double)vmovlps_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_4_ = p00.super_Tuple3<pbrt::Point3,_float>.x;
  auVar25._4_4_ = p00.super_Tuple3<pbrt::Point3,_float>.y;
  auVar14 = vandps_avx(ZEXT416((uint)p00.super_Tuple3<pbrt::Point3,_float>.z),auVar81);
  auVar30 = vandps_avx(auVar25,auVar81);
  n00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar30);
  auVar26._8_8_ = 0;
  auVar26._0_4_ = p10.super_Tuple3<pbrt::Point3,_float>.x;
  auVar26._4_4_ = p10.super_Tuple3<pbrt::Point3,_float>.y;
  n00.super_Tuple3<pbrt::Normal3,_float>.z = auVar14._0_4_;
  auVar14 = vandps_avx(auVar26,auVar81);
  auVar62 = ZEXT856(auVar14._8_8_);
  auVar30 = vandps_avx(ZEXT416((uint)p10.super_Tuple3<pbrt::Point3,_float>.z),auVar81);
  n10.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar14);
  n10.super_Tuple3<pbrt::Normal3,_float>.z = auVar30._0_4_;
  PVar87 = Max<pbrt::Point3,float>
                     ((Tuple3<pbrt::Point3,_float> *)&n00,(Tuple3<pbrt::Point3,_float> *)&n10);
  r.m.m[0][2] = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  auVar45._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar45._8_56_ = auVar62;
  r.m.m[0]._0_8_ = vmovlps_avx(auVar45._0_16_);
  auVar27._8_8_ = 0;
  auVar27._0_4_ = p01.super_Tuple3<pbrt::Point3,_float>.x;
  auVar27._4_4_ = p01.super_Tuple3<pbrt::Point3,_float>.y;
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar27,auVar75);
  auVar30 = vandps_avx(ZEXT416((uint)p01.super_Tuple3<pbrt::Point3,_float>.z),auVar75);
  n11.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar14);
  auVar28._8_8_ = 0;
  auVar28._0_4_ = p11.super_Tuple3<pbrt::Point3,_float>.x;
  auVar28._4_4_ = p11.super_Tuple3<pbrt::Point3,_float>.y;
  n11.super_Tuple3<pbrt::Normal3,_float>.z = auVar30._0_4_;
  auVar14 = vandps_avx(auVar28,auVar75);
  auVar62 = ZEXT856(auVar14._8_8_);
  auVar30 = vandps_avx(ZEXT416((uint)p11.super_Tuple3<pbrt::Point3,_float>.z),auVar75);
  local_1c8._0_8_ = vmovlps_avx(auVar14);
  local_1c8.z = auVar30._0_4_;
  PVar87 = Max<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)&n11,&local_1c8);
  n01.super_Tuple3<pbrt::Normal3,_float>.z = PVar87.super_Tuple3<pbrt::Point3,_float>.z;
  auVar46._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar46._8_56_ = auVar62;
  n01.super_Tuple3<pbrt::Normal3,_float>._0_8_ = vmovlps_avx(auVar46._0_16_);
  PVar87 = Max<pbrt::Point3,float>
                     ((Tuple3<pbrt::Point3,_float> *)&r,(Tuple3<pbrt::Point3,_float> *)&n01);
  auVar47._0_8_ = PVar87.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar47._8_56_ = auVar62;
  auVar10._8_4_ = 0x34800002;
  auVar10._0_8_ = 0x3480000234800002;
  auVar10._12_4_ = 0x34800002;
  auVar14 = vmulps_avx512vl(auVar47._0_16_,auVar10);
  local_180 = PVar87.super_Tuple3<pbrt::Point3,_float>.z * 2.3841864e-07;
  _va = vmovlps_avx(auVar14);
  if (mesh->faceIndices == (int *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = mesh->faceIndices[(int)local_168];
  }
  bVar5 = mesh->reverseOrientation;
  bVar6 = mesh->transformSwapsHandedness;
  Point3fi::Point3fi((Point3fi *)&r,(Point3f *)&local_110,(Vector3f *)&va);
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,(Point3fi *)&r,&uvTex,local_158,(Vector3f *)&local_240,
             &local_288,(Normal3f *)&local_250,(Normal3f *)&vb,time,bVar5 != bVar6);
  __return_storage_ptr__->faceIndex = iVar12;
  pNVar9 = mesh->n;
  if (pNVar9 != (Normal3f *)0x0) {
    n00.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[piVar13[local_160]].super_Tuple3<pbrt::Normal3,_float>.z;
    n00.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[piVar13[local_160]].super_Tuple3<pbrt::Normal3,_float>.x;
    n00.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[piVar13[local_160]].super_Tuple3<pbrt::Normal3,_float>.y;
    n10.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[piVar13[local_160 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    n10.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[piVar13[local_160 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    n10.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[piVar13[local_160 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    n01.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[piVar13[local_160 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    n01.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[piVar13[local_160 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    n01.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[piVar13[local_160 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    n11.super_Tuple3<pbrt::Normal3,_float>.z =
         pNVar9[piVar13[local_160 + 3]].super_Tuple3<pbrt::Normal3,_float>.z;
    n11.super_Tuple3<pbrt::Normal3,_float>.x =
         pNVar9[piVar13[local_160 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    n11.super_Tuple3<pbrt::Normal3,_float>.y =
         pNVar9[piVar13[local_160 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    t = (uv->super_Tuple2<pbrt::Point2,_float>).x;
    auVar62 = (undefined1  [56])0x0;
    NVar89 = Lerp<pbrt::Normal3,float>
                       ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                        &n00.super_Tuple3<pbrt::Normal3,_float>,
                        &n01.super_Tuple3<pbrt::Normal3,_float>);
    r.m.m[0][2] = NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar48._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar48._8_56_ = auVar62;
    r.m.m[0]._0_8_ = vmovlps_avx(auVar48._0_16_);
    auVar62 = (undefined1  [56])0x0;
    NVar89 = Lerp<pbrt::Normal3,float>
                       ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                        &n10.super_Tuple3<pbrt::Normal3,_float>,
                        &n11.super_Tuple3<pbrt::Normal3,_float>);
    local_198.z = NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar49._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar49._8_56_ = auVar62;
    local_198._0_8_ = vmovlps_avx(auVar49._0_16_);
    auVar62 = (undefined1  [56])0x0;
    NVar89 = Lerp<pbrt::Normal3,float>(t,(Tuple3<pbrt::Normal3,_float> *)&r,&local_198);
    local_1c8.z = NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar50._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar50._8_56_ = auVar62;
    local_1c8._0_8_ = vmovlps_avx(auVar50._0_16_);
    auVar29._0_4_ =
         NVar89.super_Tuple3<pbrt::Normal3,_float>.x * NVar89.super_Tuple3<pbrt::Normal3,_float>.x;
    auVar29._4_4_ =
         NVar89.super_Tuple3<pbrt::Normal3,_float>.y * NVar89.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar29._8_4_ = auVar62._0_4_ * auVar62._0_4_;
    auVar29._12_4_ = auVar62._4_4_ * auVar62._4_4_;
    auVar14 = vhaddps_avx(auVar29,auVar29);
    auVar62 = (undefined1  [56])0x0;
    if (0.0 < local_1c8.z * local_1c8.z + auVar14._0_4_) {
      NVar89 = Normalize<float>((Normal3<float> *)&local_1c8);
      local_1c8.z = NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar51._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar51._8_56_ = auVar62;
      local_1c8._0_8_ = vmovlps_avx(auVar51._0_16_);
      NVar89 = Normalize<float>(&(__return_storage_ptr__->super_Interaction).n);
      local_268 = NVar89.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar52._0_8_ = NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar52._8_56_ = auVar62;
      auVar30 = auVar52._0_16_;
      r.m.m[0]._0_8_ = vmovlps_avx(auVar30);
      auVar69 = ZEXT460((uint)local_1c8.y);
      auVar62 = (undefined1  [56])0x0;
      local_100.x = local_1c8.x;
      local_100.y = local_1c8.y;
      local_100.z = local_1c8.z;
      r.m.m[0][2] = local_268;
      VVar88 = Cross<float>((Vector3<float> *)&r,(Vector3<float> *)&local_100);
      auVar68._0_4_ = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar68._4_60_ = auVar69;
      auVar53._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar53._8_56_ = auVar62;
      auVar23 = auVar53._0_16_;
      auVar76._0_4_ =
           VVar88.super_Tuple3<pbrt::Vector3,_float>.x * VVar88.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar76._4_4_ =
           VVar88.super_Tuple3<pbrt::Vector3,_float>.y * VVar88.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar76._8_4_ = auVar62._0_4_ * auVar62._0_4_;
      auVar76._12_4_ = auVar62._4_4_ * auVar62._4_4_;
      local_198._0_8_ = vmovlps_avx(auVar23);
      auVar14 = vmovshdup_avx(auVar76);
      auVar14 = vfmadd231ss_fma(auVar14,auVar23,auVar23);
      auVar14 = vfmadd231ss_fma(auVar14,auVar68._0_16_,auVar68._0_16_);
      if (1e-14 < auVar14._0_4_) {
        uVar60 = 0;
        local_198.z = auVar68._0_4_;
        NVar89 = Lerp<pbrt::Normal3,float>
                           ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                            &n10.super_Tuple3<pbrt::Normal3,_float>,
                            &n11.super_Tuple3<pbrt::Normal3,_float>);
        uStack_270 = uVar60;
        local_278 = (undefined1  [8])NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar62 = (undefined1  [56])0x0;
        NVar90 = Lerp<pbrt::Normal3,float>
                           ((uv->super_Tuple2<pbrt::Point2,_float>).y,
                            &n00.super_Tuple3<pbrt::Normal3,_float>,
                            &n01.super_Tuple3<pbrt::Normal3,_float>);
        auVar54._0_8_ = NVar90.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar54._8_56_ = auVar62;
        auVar14 = vsubps_avx(_local_278,auVar54._0_16_);
        local_100.z = NVar89.super_Tuple3<pbrt::Normal3,_float>.z -
                      NVar90.super_Tuple3<pbrt::Normal3,_float>.z;
        local_100._0_8_ = vmovlps_avx(auVar14);
        uVar60 = 0;
        NVar89 = Lerp<pbrt::Normal3,float>
                           ((uv->super_Tuple2<pbrt::Point2,_float>).x,
                            &n01.super_Tuple3<pbrt::Normal3,_float>,
                            &n11.super_Tuple3<pbrt::Normal3,_float>);
        uStack_270 = uVar60;
        local_278 = (undefined1  [8])NVar89.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar62 = (undefined1  [56])0x0;
        NVar90 = Lerp<pbrt::Normal3,float>
                           ((uv->super_Tuple2<pbrt::Point2,_float>).x,
                            &n00.super_Tuple3<pbrt::Normal3,_float>,
                            &n10.super_Tuple3<pbrt::Normal3,_float>);
        auVar55._0_8_ = NVar90.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar55._8_56_ = auVar62;
        auVar14 = vsubps_avx(_local_278,auVar55._0_16_);
        auVar62 = ZEXT856(auVar14._8_8_);
        local_40.z = NVar89.super_Tuple3<pbrt::Normal3,_float>.z -
                     NVar90.super_Tuple3<pbrt::Normal3,_float>.z;
        local_40._0_8_ = vmovlps_avx(auVar14);
        VVar88 = Normalize<float>((Vector3<float> *)&local_198);
        local_198.z = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar56._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar56._8_56_ = auVar62;
        local_198._0_8_ = vmovlps_avx(auVar56._0_16_);
        auVar14 = vmovshdup_avx(auVar30);
        auVar14 = vfmadd132ss_fma(auVar14,ZEXT416((uint)(local_268 * local_1c8.z)),
                                  ZEXT416((uint)local_1c8.y));
        auVar23 = vfmsub213ss_fma(ZEXT416((uint)local_1c8.z),ZEXT416((uint)local_268),
                                  ZEXT416((uint)(local_268 * local_1c8.z)));
        auVar30 = vfmadd132ss_fma(auVar30,ZEXT416((uint)(auVar14._0_4_ + auVar23._0_4_)),
                                  ZEXT416((uint)local_1c8.x));
        auVar14 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar30,auVar30);
        auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
        auVar14 = vsqrtss_avx(auVar14,auVar14);
        auVar62 = ZEXT856(auVar14._8_8_);
        Rotate(&r,auVar14._0_4_,auVar30._0_4_,(Vector3f *)&local_198);
        VVar88 = Transform::operator()(&r,(Vector3<float> *)&local_240);
        local_50.z = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar57._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar57._8_56_ = auVar62;
        local_50._0_8_ = vmovlps_avx(auVar57._0_16_);
        VVar88 = Transform::operator()(&r,&local_288);
        local_60.z = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar58._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar58._8_56_ = auVar62;
        local_60._0_8_ = vmovlps_avx(auVar58._0_16_);
        auVar62 = (undefined1  [56])0x0;
        local_70.x = local_1c8.x;
        local_70.y = local_1c8.y;
        local_70.z = local_1c8.z;
        VVar88 = GramSchmidt<float>((Vector3<float> *)&local_50,(Vector3<float> *)&local_70);
        local_50.z = VVar88.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar59._0_8_ = VVar88.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar59._8_56_ = auVar62;
        local_50._0_8_ = vmovlps_avx(auVar59._0_16_);
        SurfaceInteraction::SetShadingGeometry
                  (__return_storage_ptr__,(Normal3f *)&local_1c8,(Vector3f *)&local_50,
                   (Vector3f *)&local_60,(Normal3f *)&local_100,(Normal3f *)&local_40,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex,
                                                          const Point2f &uv, Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }